

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetTypedArrayBuffer
                  (JSContext *ctx,JSValue obj,size_t *pbyte_offset,size_t *pbyte_length,
                  size_t *pbytes_per_element)

{
  JSMapIteratorData *pJVar1;
  JSMapRecord *pJVar2;
  JSObject *pJVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t iVar6;
  JSValue JVar7;
  
  pJVar3 = get_typed_array(ctx,obj,0);
  iVar6 = 6;
  if (pJVar3 != (JSObject *)0x0) {
    pJVar1 = (pJVar3->u).map_iterator_data;
    pJVar2 = pJVar1->cur_record;
    if (*(char *)((long)&((pJVar2->hash_link).next)->prev + 4) == '\0') {
      if (pbyte_offset != (size_t *)0x0) {
        *pbyte_offset = (ulong)(uint)pJVar1[1].obj.u.int32;
      }
      if (pbyte_length != (size_t *)0x0) {
        *pbyte_length = (ulong)*(uint *)((long)&pJVar1[1].obj.u + 4);
      }
      if (pbytes_per_element != (size_t *)0x0) {
        *pbytes_per_element =
             (long)(1 << ("includes"[(ulong)(pJVar3->field_0).header.dummy2 + 1] & 0x1fU));
      }
      pJVar2->ref_count = pJVar2->ref_count + 1;
      uVar4 = (ulong)pJVar2 & 0xffffffff00000000;
      uVar5 = (ulong)pJVar2 & 0xffffffff;
      iVar6 = -1;
      goto LAB_0012cde0;
    }
    JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
  }
  uVar5 = 0;
  uVar4 = 0;
LAB_0012cde0:
  JVar7.tag = iVar6;
  JVar7.u.ptr = (void *)(uVar5 | uVar4);
  return JVar7;
}

Assistant:

JSValue JS_GetTypedArrayBuffer(JSContext *ctx, JSValueConst obj,
                               size_t *pbyte_offset,
                               size_t *pbyte_length,
                               size_t *pbytes_per_element)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, obj, FALSE);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    ta = p->u.typed_array;
    if (pbyte_offset)
        *pbyte_offset = ta->offset;
    if (pbyte_length)
        *pbyte_length = ta->length;
    if (pbytes_per_element) {
        *pbytes_per_element = 1 << typed_array_size_log2(p->class_id);
    }
    return JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
}